

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

int do_handle_define(dmr_C *C,stream *stream,token **line,token *token,int attr)

{
  uint *puVar1;
  ulong *puVar2;
  uint uVar3;
  ident *piVar4;
  dmr_C *pdVar5;
  uint uVar6;
  int iVar7;
  position pVar8;
  position pVar9;
  position pVar10;
  symbol *sym;
  uint uVar11;
  char *pcVar12;
  token *list2;
  position pVar13;
  position pVar14;
  undefined4 in_register_00000084;
  int iVar15;
  position *p;
  position local_60;
  ident *local_58;
  position local_50;
  position local_48;
  dmr_C *local_40;
  byte local_31;
  token *arglist;
  
  pVar10._4_4_ = in_register_00000084;
  pVar10._0_4_ = attr;
  pVar9 = (position)stream->name;
  if ((*(uint *)pVar9 & 0x3f) != 2) {
    pVar8 = *(position *)stream;
    pcVar12 = "expected identifier to \'define\'";
    goto LAB_0011cb24;
  }
  uVar3 = (uint)line;
  pVar10 = *(position *)((long)pVar9 + 8);
  local_58 = *(ident **)((long)pVar9 + 0x10);
  pVar8 = *(position *)pVar10;
  pVar14 = pVar10;
  local_50 = pVar9;
  if ((pVar8._0_4_ >> 0x15 & 1) == 0) {
    if (((pVar8._0_4_ & 0x3f) != 0x11) || (*(uint *)((long)pVar10 + 0x10) != 0x28)) {
      pVar14 = (position)&dmrC_eof_token_entry_;
      if (pVar10 != (position)&dmrC_eof_token_entry_) {
        dmrC_warning(C,pVar8,"no whitespace before object-like macro body");
        pVar14 = pVar10;
      }
      goto LAB_0011cbd5;
    }
    pVar9 = *(position *)((long)pVar10 + 8);
    pVar14 = (position)((ulong)pVar8 & 0xffffffffffdfffc0 | 0x1a);
    *(position *)pVar10 = pVar14;
    *(uint *)((long)pVar10 + 0x10) = 0;
    pVar8 = *(position *)pVar9;
    if (((pVar8._0_4_ & 0x3f) != 0x11) || (*(uint *)((long)pVar9 + 0x10) != 0x29)) {
      while (uVar11 = pVar8._0_4_ & 0x3f, uVar11 == 2) {
        if (*(ident **)((long)pVar9 + 0x10) == C->S->__VA_ARGS___ident) {
          pcVar12 = "__VA_ARGS__ can only appear in the expansion of a C99 variadic macro";
          goto LAB_0011cb24;
        }
        uVar11 = *(uint *)((long)pVar10 + 0x10) + 1 & 0x3ff;
        *(uint *)((long)pVar10 + 0x10) = *(uint *)((long)pVar10 + 0x10) & 0xfffffc00 | uVar11;
        if (uVar11 == 0) goto LAB_0011d0de;
        pVar13 = *(position *)((long)pVar9 + 8);
        pVar14 = *(position *)pVar13;
        if ((pVar14._0_4_ & 0x3f) != 0x11) {
LAB_0011d096:
          if (pVar13 != (position)&dmrC_eof_token_entry_) goto LAB_0011d0b7;
          pVar14 = *(position *)pVar9;
          goto LAB_0011d14d;
        }
        iVar15 = *(int *)((long)pVar13 + 0x10);
        if (iVar15 != 0x2c) {
          if (iVar15 == 0x29) {
            *(ulong *)pVar13 = (ulong)pVar14 & 0xffffffffffffffc0 | 0x1a;
            *(undefined4 *)((long)pVar13 + 0x10) = 0;
            pVar14 = *(position *)((long)pVar13 + 8);
            goto LAB_0011d112;
          }
          if (iVar15 != 0x117) goto LAB_0011d096;
          puVar1 = *(uint **)((long)pVar13 + 8);
          if (((*puVar1 & 0x3f) != 0x11) || (puVar1[4] != 0x29)) goto LAB_0011d14d;
          *(ulong *)pVar13 = (ulong)pVar14 & 0xffffffffffffffc0 | 0x1a;
          *(undefined4 *)((long)pVar13 + 0x10) = 0x40000000;
          *(token **)(*(long *)((long)pVar9 + 8) + 8) = &dmrC_eof_token_entry_;
          pVar14 = *(position *)(puVar1 + 2);
          goto LAB_0011d121;
        }
        pVar14 = (position)((ulong)pVar14 & 0xffffffffffffffc0 | 0x1a);
        *(position *)pVar13 = pVar14;
        *(undefined4 *)((long)pVar13 + 0x10) = 0;
        pVar9 = *(position *)((long)pVar13 + 8);
        pVar8 = *(position *)pVar9;
      }
      pVar13 = pVar9;
      if (uVar11 == 0x11) {
        if (*(uint *)((long)pVar9 + 0x10) == 0x117) {
          puVar2 = *(ulong **)((long)pVar9 + 8);
          pVar14 = (position)((ulong)pVar8 & 0xffffffffffffffc0 | 2);
          *(position *)pVar9 = pVar14;
          *(ident **)((long)pVar9 + 0x10) = C->S->__VA_ARGS___ident;
          if (((*puVar2 & 0x3f) == 0x11) && ((uint)puVar2[2] == 0x29)) {
            uVar11 = *(uint *)((long)pVar10 + 0x10) + 1 & 0x3ff;
            *(uint *)((long)pVar10 + 0x10) = *(uint *)((long)pVar10 + 0x10) & 0xfffffc00 | uVar11;
            if (uVar11 == 0) {
LAB_0011d0de:
              pVar8 = *(position *)pVar9;
              pcVar12 = "too many arguments in macro definition";
              goto LAB_0011cb24;
            }
            pVar14 = *(position *)(puVar2 + 1);
            *puVar2 = *puVar2 & 0xffffffffffffffc0 | 0x1a;
            *(uint *)(puVar2 + 2) = (uint)puVar2[2] & 0x80000000 | 0x40000000;
LAB_0011d112:
            *(token **)(*(long *)((long)pVar9 + 8) + 8) = &dmrC_eof_token_entry_;
            goto LAB_0011d121;
          }
        }
        else if (pVar9 != (position)&dmrC_eof_token_entry_) {
          if (*(uint *)((long)pVar9 + 0x10) != 0x2c) goto LAB_0011d0b7;
          pcVar12 = "parameter name missing";
          goto LAB_0011cb24;
        }
      }
      else if (pVar9 != (position)&dmrC_eof_token_entry_) {
LAB_0011d0b7:
        pcVar12 = dmrC_show_token(C,(token *)pVar13);
        dmrC_sparse_error(C,*(position *)pVar13,"\"%s\" may not appear in macro parameter list",
                          pcVar12);
        return 1;
      }
LAB_0011d14d:
      pcVar12 = "missing \')\' in macro parameter list";
      pVar8 = pVar14;
LAB_0011cb24:
      dmrC_sparse_error(C,pVar8,pcVar12,pVar9,pVar10);
      return 1;
    }
    pVar14 = *(position *)((long)pVar9 + 8);
    *(token **)((long)pVar10 + 8) = &dmrC_eof_token_entry_;
LAB_0011d121:
    if (pVar14 == (position)0x0) {
      return 1;
    }
  }
  else {
LAB_0011cbd5:
    pVar10 = (position)0x0;
  }
  pVar9 = *(position *)pVar14;
  local_60 = pVar14;
  if (((pVar9._0_4_ & 0x3f) == 0x11) && (*(uint *)((long)pVar14 + 0x10) == 0x111)) {
    pcVar12 = "\'##\' cannot appear at the ends of macro expansion";
LAB_0011cdf1:
    dmrC_sparse_error(C,pVar9,pcVar12);
    return 1;
  }
  p = &local_60;
  local_48 = pVar10;
  local_40 = C;
  for (; pVar14 != (position)&dmrC_eof_token_entry_; pVar14 = *(position *)((long)pVar14 + 8)) {
    if ((((*(uint *)pVar14 & 0x3f) == 0x11) && (*(uint *)((long)pVar14 + 0x10) == 0x23)) &&
       (pVar14 = (position)handle_hash(local_40,(token **)p,(token *)local_48),
       pVar14 == (position)0x0)) {
      return 1;
    }
    uVar11 = **(uint **)((long)pVar14 + 8) & 0x3f;
    arglist = (token *)(ulong)uVar11;
    if ((uVar11 == 0x11) && ((*(uint **)((long)pVar14 + 8))[4] == 0x111)) {
      uVar11 = 0;
      if ((*(uint *)pVar14 & 0x3f) == 0x11) {
        uVar11 = (uint)(*(int *)((long)pVar14 + 0x10) == 0x2c);
      }
      try_arg((dmr_C *)pVar14,(token *)0x16,local_48._0_4_,arglist);
      pVar10 = *(position *)((long)pVar14 + 8);
      pVar8 = pVar14;
      do {
        while ((pVar13 = *(position *)((long)pVar10 + 8), (*(uint *)pVar13 & 0x3f) == 0x11 &&
               (((anon_union_8_7_c7bfca54_for_token_2 *)((long)pVar13 + 0x10))->special == 0x111)))
        {
          *(position *)((long)pVar14 + 8) = pVar13;
          dmrC_allocator_free(&C->token_allocator,(void *)pVar10);
          pVar10 = pVar13;
        }
        pVar9 = (position)(*(ulong *)pVar10 & 0xffffffffffffffc0 | 0x17);
        *(position *)pVar10 = pVar9;
        if (pVar13 == (position)&dmrC_eof_token_entry_) {
          pcVar12 = "\'##\' cannot appear at the ends of macro expansion";
          C = local_40;
          goto LAB_0011cdf1;
        }
        pVar14 = pVar13;
        if ((((*(uint *)pVar13 & 0x3f) == 0x11) &&
            (((anon_union_8_7_c7bfca54_for_token_2 *)((long)pVar13 + 0x10))->special == 0x23)) &&
           (pVar14 = (position)handle_hash(local_40,(token **)((long)pVar10 + 8),(token *)local_48),
           pVar14 == (position)0x0)) {
          return 1;
        }
        uVar6 = try_arg((dmr_C *)pVar14,(token *)0x16,local_48._0_4_,arglist);
        if (((uVar11 != 1) || (uVar11 = uVar6, uVar6 == 0)) &&
           (uVar11 = 0, pVar8 = pVar14, (*(uint *)pVar14 & 0x3f) == 0x11)) {
          uVar11 = (uint)(*(int *)((long)pVar14 + 0x10) == 0x2c);
        }
        pVar10 = *(position *)((long)pVar14 + 8);
      } while (((*(uint *)pVar10 & 0x3f) == 0x11) &&
              (((anon_union_8_7_c7bfca54_for_token_2 *)((long)pVar10 + 0x10))->special == 0x111));
      if (uVar11 == 2) {
        *(ulong *)pVar8 = *(ulong *)pVar8 & 0xffffffffffffffc0 | 0x18;
      }
    }
    else {
      try_arg((dmr_C *)pVar14,(token *)0x14,local_48._0_4_,arglist);
    }
    pVar9 = *(position *)pVar14;
    uVar11 = pVar9._0_4_ & 0x3f;
    if (uVar11 - 0xf < 2) {
      *(uint *)*(position *)((long)pVar14 + 0x10) =
           *(uint *)*(position *)((long)pVar14 + 0x10) | 0x80000000;
    }
    else if (uVar11 == 1) {
      pcVar12 = "too many instances of argument in body";
      C = local_40;
      goto LAB_0011cdf1;
    }
    p = (position *)((long)pVar14 + 8);
  }
  pVar10 = (position)alloc_token(local_40,(position *)local_60);
  piVar4 = local_58;
  *(ulong *)pVar10 = *(ulong *)pVar10 & 0xffffffffffffffc0 | 0x19;
  ((anon_union_8_7_c7bfca54_for_token_2 *)((long)pVar10 + 0x10))->ident = local_58;
  *(position *)((long)pVar10 + 8) = *p;
  *p = pVar10;
  pVar10 = local_60;
  if (local_60 == (position)0x0) {
    return 1;
  }
  sym = dmrC_lookup_symbol(piVar4,NS_UNDEF|NS_MACRO);
  iVar15 = 1;
  if (sym == (symbol *)0x0) {
LAB_0011cf1a:
    pdVar5 = local_40;
    sym = dmrC_alloc_symbol(local_40->S,*(position *)local_50,3);
    piVar4 = local_58;
    dmrC_bind_symbol(pdVar5->S,sym,local_58,NS_MACRO);
    ptrlist_add((ptr_list **)&pdVar5->macros,piVar4,&pdVar5->ptrlist_allocator);
  }
  else {
    uVar11 = *(uint *)sym >> 0x12 & 3;
    if ((int)uVar3 < (int)uVar11) {
      return 1;
    }
    local_31 = (*(uint *)sym & 0x1ff00) == 0x100 && uVar11 == uVar3;
    iVar7 = token_list_different
                      ((dmr_C *)(sym->field_14).field_0.expansion,(token *)pVar10,(token *)local_50)
    ;
    if ((iVar7 == 0) &&
       (iVar7 = token_list_different
                          ((dmr_C *)(sym->field_14).field_0.arglist,(token *)local_48,list2),
       iVar7 == 0)) {
      if (local_31 != 0) {
        return 1;
      }
      if (sym->scope == local_40->file_scope) goto LAB_0011cf77;
      goto LAB_0011cf1a;
    }
    pdVar5 = local_40;
    if (((local_31 & uVar3 == 1) != 0) || ((sym->field_14).field_0.used_in == local_40->file_scope))
    {
      dmrC_warning(local_40,*(position *)local_50,"preprocessor token %.*s redefined",
                   (ulong)local_58->len,&local_58->field_0x12);
      dmrC_info(pdVar5,sym->pos,"this was the original definition");
    }
    if (sym->scope != pdVar5->file_scope) goto LAB_0011cf1a;
  }
  (sym->field_14).field_0.expansion = (token *)pVar10;
  (sym->field_14).field_0.arglist = (token *)local_48;
  dmrC_allocator_free(&C->token_allocator,stream);
  iVar15 = 0;
LAB_0011cf77:
  (sym->field_14).field_0.used_in = (scope *)0x0;
  *(uint *)sym = (*(uint *)sym & 0xfff200ff) + (uVar3 & 3) * 0x40000 + 0x100;
  return iVar15;
}

Assistant:

static int do_handle_define(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token, int attr)
{
	struct token *arglist, *expansion;
	struct token *left = token->next;
	struct symbol *sym;
	struct ident *name;
	int ret;

        (void) stream;
        (void) line;
        
	if (dmrC_token_type(left) != TOKEN_IDENT) {
		dmrC_sparse_error(C, token->pos, "expected identifier to 'define'");
		return 1;
	}

	name = left->ident;

	arglist = NULL;
	expansion = left->next;
	if (!expansion->pos.whitespace) {
		if (dmrC_match_op(expansion, '(')) {
			arglist = expansion;
			expansion = parse_arguments(C, expansion);
			if (!expansion)
				return 1;
		} else if (!dmrC_eof_token(expansion)) {
			dmrC_warning(C, expansion->pos,
				"no whitespace before object-like macro body");
		}
	}

	expansion = parse_expansion(C, expansion, arglist, name);
	if (!expansion)
		return 1;

	ret = 1;
	sym = dmrC_lookup_symbol(name, (enum namespace_type) (NS_MACRO | NS_UNDEF));
	if (sym) {
		int clean;

		if (attr < sym->attr)
			goto out;

		clean = (attr == sym->attr && sym->ns == NS_MACRO);

		if (token_list_different(C, sym->expansion, expansion) ||
		    token_list_different(C, sym->arglist, arglist)) {
			ret = 0;
			if ((clean && attr == SYM_ATTR_NORMAL)
					|| sym->used_in == C->file_scope) {
				dmrC_warning(C, left->pos, "preprocessor token %.*s redefined",
						name->len, name->name);
				dmrC_info(C, sym->pos, "this was the original definition");
			}
		} else if (clean)
			goto out;
	}

	if (!sym || sym->scope != C->file_scope) {
		sym = dmrC_alloc_symbol(C->S, left->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, name, NS_MACRO);
		dmrC_add_ident(C, &C->macros, name);
		ret = 0;
	}

	if (!ret) {
		sym->expansion = expansion;
		sym->arglist = arglist;
		dmrC_allocator_free(&C->token_allocator, token);	/* Free the "define" token, but not the rest of the line */
	}

	sym->ns = NS_MACRO;
	sym->used_in = NULL;
	sym->attr = attr;
out:
	return ret;
}